

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O2

Variable __thiscall LiteScript::Array::ConstantGet(Array *this,char *name)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  char *in_RDX;
  uint *extraout_RDX;
  long lVar5;
  long lVar6;
  Variable VVar7;
  uint *puVar4;
  
  lVar1 = *(long *)(name + 8);
  lVar2 = *(long *)name;
  lVar6 = 0x10;
  lVar5 = 0;
  do {
    if (((lVar1 - lVar2) / 0x30 & 0xffffffffU) * 0x30 + 0x30 == lVar5 + 0x30) {
      VVar7 = Memory::Create((Memory *)this,*(Type **)(name + 0x30));
      puVar4 = VVar7.nb_ref;
      goto LAB_0013ce98;
    }
    lVar6 = lVar6 + -0x30;
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (lVar5 + *(long *)name),in_RDX);
    lVar5 = lVar5 + 0x30;
  } while (!bVar3);
  Variable::Variable((Variable *)this,(Variable *)(*(long *)name - lVar6));
  puVar4 = extraout_RDX;
LAB_0013ce98:
  VVar7.nb_ref = puVar4;
  VVar7.obj = (Object *)this;
  return VVar7;
}

Assistant:

LiteScript::Variable LiteScript::Array::ConstantGet(const char * name) const {
    for (unsigned int i = 0, sz = this->named.size(); i < sz; i++) {
        if (this->named[i].first == name)
            return Variable(this->named[i].second);
    }
    return this->memory.Create(Type::UNDEFINED);
}